

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCoordinator.cpp
# Opt level: O0

TimeProcessingResult __thiscall
helics::TimeCoordinator::processTimeMessage(TimeCoordinator *this,ActionMessage *cmd)

{
  TimeState TVar1;
  undefined8 uVar2;
  TimeProcessingResult TVar3;
  bool bVar4;
  action_t aVar5;
  DependencyInfo *this_00;
  ActionMessage *in_RSI;
  ActionMessage *in_RDI;
  ActionMessage ge;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  checkRes;
  TimeProcessingResult procRes;
  DependencyInfo *dep;
  ActionMessage resp;
  ActionMessage treq_1;
  ActionMessage treq;
  undefined4 in_stack_fffffffffffffc68;
  int32_t in_stack_fffffffffffffc6c;
  undefined4 in_stack_fffffffffffffc70;
  GlobalFederateId in_stack_fffffffffffffc74;
  TimeDependencies *in_stack_fffffffffffffc78;
  undefined8 in_stack_fffffffffffffc80;
  action_t aVar6;
  GlobalFederateId in_stack_fffffffffffffc90;
  undefined4 uVar7;
  GlobalFederateId in_stack_fffffffffffffc9c;
  undefined4 in_stack_fffffffffffffca0;
  undefined4 in_stack_fffffffffffffca4;
  undefined1 waiting;
  undefined4 in_stack_fffffffffffffca8;
  GlobalFederateId in_stack_fffffffffffffcac;
  GlobalFederateId in_stack_fffffffffffffcb4;
  int32_t in_stack_fffffffffffffce4;
  TimeData *in_stack_fffffffffffffce8;
  BaseTimeCoordinator *in_stack_fffffffffffffcf0;
  GlobalFederateId in_stack_fffffffffffffcfc;
  int local_2a8;
  TimeProcessingResult local_27d;
  ActionMessage local_260;
  BaseType local_1a8;
  undefined4 local_1a4;
  BaseType local_e8;
  GlobalFederateId local_d4 [3];
  undefined4 local_c8;
  undefined8 local_b0;
  ActionMessage *local_18;
  TimeProcessingResult local_1;
  
  aVar6 = (action_t)((ulong)in_stack_fffffffffffffc80 >> 0x20);
  local_18 = in_RSI;
  aVar5 = ActionMessage::action(in_RSI);
  if ((aVar5 != cmd_disconnect) && (3 < (uint)(aVar5 + (cmd_route_ack|cmd_init)))) {
    if (aVar5 == cmd_request_current_time) {
      if ((((in_RDI->payload).buffer._M_elems[0x17] & 1) == 0) &&
         (in_RDI[1].payload.buffer._M_elems[0x20] != 10)) {
        BaseTimeCoordinator::generateTimeRequest
                  (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,in_stack_fffffffffffffcfc,
                   in_stack_fffffffffffffce4);
        if ((in_RDI[3].Tdemin.internalTimeCode & 0x10000000000) != 0) {
          setActionFlag<helics::ActionMessage,helics::InterfaceFlags>(&local_260,destination_target)
          ;
          bVar4 = GlobalFederateId::operator==(&local_18->source_id,(GlobalBrokerId)0x1);
          if (bVar4) {
            *(undefined1 *)((long)&in_RDI[3].Tdemin.internalTimeCode + 5) = 0;
          }
        }
        std::function<void_(const_helics::ActionMessage_&)>::operator()
                  ((function<void_(const_helics::ActionMessage_&)> *)
                   CONCAT44(in_stack_fffffffffffffc74.gid,in_stack_fffffffffffffc70),
                   (ActionMessage *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
        TimeDependencies::updateTime
                  (in_stack_fffffffffffffc78,
                   (ActionMessage *)
                   CONCAT44(in_stack_fffffffffffffc74.gid,in_stack_fffffffffffffc70));
        ActionMessage::~ActionMessage
                  ((ActionMessage *)
                   CONCAT44(in_stack_fffffffffffffc74.gid,in_stack_fffffffffffffc70));
      }
      else {
        local_1a4 = *(undefined4 *)((in_RDI->payload).buffer._M_elems + 8);
        local_1a8 = (local_18->source_id).gid;
        ActionMessage::ActionMessage(in_RDI,aVar6,(GlobalFederateId)0x26,in_stack_fffffffffffffc90);
        ActionMessage::setExtraDestData
                  ((ActionMessage *)
                   CONCAT44(in_stack_fffffffffffffc74.gid,in_stack_fffffffffffffc70),
                   in_stack_fffffffffffffc6c);
        std::function<void_(const_helics::ActionMessage_&)>::operator()
                  ((function<void_(const_helics::ActionMessage_&)> *)
                   CONCAT44(in_stack_fffffffffffffc74.gid,in_stack_fffffffffffffc70),
                   (ActionMessage *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
        ActionMessage::~ActionMessage
                  ((ActionMessage *)
                   CONCAT44(in_stack_fffffffffffffc74.gid,in_stack_fffffffffffffc70));
      }
      return PROCESSED;
    }
    if (((uint)(aVar5 + ~(cmd_request_current_time|cmd_tick)) < 2) ||
       ((uint)(aVar5 + ~cmd_time_barrier_request) < 2)) {
      TVar3 = processTimeBlockMessage
                        ((TimeCoordinator *)
                         CONCAT44(in_stack_fffffffffffffcac.gid,in_stack_fffffffffffffca8),
                         (ActionMessage *)
                         CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0));
      return TVar3;
    }
    if (aVar5 == cmd_force_time_grant) {
      bVar4 = TimeRepresentation<count_time<9,_long>_>::operator<
                        ((TimeRepresentation<count_time<9,_long>_> *)
                         (in_RDI[1].payload.buffer._M_elems + 0x38),&local_18->actionTime);
      if (!bVar4) {
        return NOT_PROCESSED;
      }
      *(baseType *)(in_RDI[1].payload.buffer._M_elems + 0x38) =
           (local_18->actionTime).internalTimeCode;
      uVar2 = *(undefined8 *)(in_RDI[1].payload.buffer._M_elems + 0x38);
      in_RDI[2].source_id = (GlobalFederateId)(int)uVar2;
      in_RDI[2].source_handle = (InterfaceHandle)(int)((ulong)uVar2 >> 0x20);
      ActionMessage::ActionMessage
                ((ActionMessage *)CONCAT44(aVar5,in_stack_fffffffffffffc90.gid),
                 (action_t)((ulong)in_RDI >> 0x20));
      local_c8 = *(undefined4 *)((in_RDI->payload).buffer._M_elems + 8);
      local_b0 = *(undefined8 *)(in_RDI[1].payload.buffer._M_elems + 0x38);
      in_RDI[1].Tdemin.internalTimeCode = *(baseType *)(in_RDI[1].payload.buffer._M_elems + 0x38);
      in_RDI[1].Tso.internalTimeCode = *(baseType *)(in_RDI[1].payload.buffer._M_elems + 0x38);
      *(undefined8 *)in_RDI[1].payload.buffer._M_elems =
           *(undefined8 *)(in_RDI[1].payload.buffer._M_elems + 0x38);
      in_RDI[1].payload.buffer._M_elems[0x20] = 5;
      local_d4[0].gid = 0;
      GlobalFederateId::GlobalFederateId(local_d4);
      transmitTimingMessages
                ((TimeCoordinator *)
                 CONCAT44(in_stack_fffffffffffffcac.gid,in_stack_fffffffffffffca8),
                 (ActionMessage *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                 in_stack_fffffffffffffcb4);
      local_1 = PROCESSED;
      ActionMessage::~ActionMessage
                ((ActionMessage *)CONCAT44(in_stack_fffffffffffffc74.gid,in_stack_fffffffffffffc70))
      ;
      return local_1;
    }
    if ((aVar5 != cmd_local_error) && (aVar5 != cmd_global_error)) goto LAB_00559713;
  }
  local_e8 = (local_18->source_id).gid;
  (**(code **)(*(long *)in_RDI + 0x38))(in_RDI,local_e8);
LAB_00559713:
  bVar4 = isDelayableMessage((ActionMessage *)
                             CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
                             in_stack_fffffffffffffc74);
  if (bVar4) {
    this_00 = TimeDependencies::getDependencyInfo
                        ((TimeDependencies *)
                         CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                         in_stack_fffffffffffffcac);
    if (this_00 == (DependencyInfo *)0x0) {
      return NOT_PROCESSED;
    }
    TVar1 = (this_00->super_TimeData).mTimeState;
    in_stack_fffffffffffffc74.gid = CONCAT13(TVar1,(int3)in_stack_fffffffffffffc74.gid);
    if (TVar1 != exec_requested_iterative) {
      if (TVar1 == time_requested_iterative) {
        TimeRepresentation<count_time<9,_long>_>::operator>
                  ((TimeRepresentation<count_time<9,_long>_> *)this_00,
                   (TimeRepresentation<count_time<9,_long>_> *)
                   &in_RDI[1].stringData.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
        if (*(char *)((long)&in_RDI[3].Tdemin.internalTimeCode + 1) != '\0') {
          TimeRepresentation<count_time<9,_long>_>::operator==
                    ((TimeRepresentation<count_time<9,_long>_> *)
                     &in_RDI[1].stringData.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish,
                     (TimeRepresentation<count_time<9,_long>_> *)this_00);
        }
      }
      else if (TVar1 == time_requested) {
        TimeRepresentation<count_time<9,_long>_>::operator>
                  ((TimeRepresentation<count_time<9,_long>_> *)this_00,
                   (TimeRepresentation<count_time<9,_long>_> *)
                   &in_RDI[1].stringData.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
      }
    }
  }
  aVar6 = (action_t)((ulong)in_RDI >> 0x20);
  waiting = (undefined1)((uint)in_stack_fffffffffffffca4 >> 0x18);
  local_27d = TimeDependencies::updateTime
                        (in_stack_fffffffffffffc78,
                         (ActionMessage *)
                         CONCAT44(in_stack_fffffffffffffc74.gid,in_stack_fffffffffffffc70));
  if (local_27d == PROCESSED_AND_CHECK) {
    TimeDependencies::checkForIssues_abi_cxx11_
              ((TimeDependencies *)CONCAT44(in_stack_fffffffffffffcac.gid,in_stack_fffffffffffffca8)
               ,(bool)waiting);
    if (local_2a8 != 0) {
      ActionMessage::ActionMessage
                ((ActionMessage *)CONCAT44(aVar5,in_stack_fffffffffffffc90.gid),aVar6);
      uVar7 = 0;
      GlobalFederateId::GlobalFederateId
                ((GlobalFederateId *)&stack0xfffffffffffffc9c,(GlobalBrokerId)0x0);
      SmallBuffer::operator=
                ((SmallBuffer *)CONCAT44(in_stack_fffffffffffffc9c.gid,uVar7),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(aVar5,in_stack_fffffffffffffc90.gid));
      std::function<void_(const_helics::ActionMessage_&)>::operator()
                ((function<void_(const_helics::ActionMessage_&)> *)
                 CONCAT44(in_stack_fffffffffffffc74.gid,in_stack_fffffffffffffc70),
                 (ActionMessage *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
      ActionMessage::~ActionMessage
                ((ActionMessage *)CONCAT44(in_stack_fffffffffffffc74.gid,in_stack_fffffffffffffc70))
      ;
    }
    local_27d = PROCESSED;
    std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x55997e);
  }
  return local_27d;
}

Assistant:

TimeProcessingResult TimeCoordinator::processTimeMessage(const ActionMessage& cmd)
{
    switch (cmd.action()) {
        case CMD_TIME_BLOCK:
        case CMD_TIME_UNBLOCK:
        case CMD_TIME_BARRIER:
        case CMD_TIME_BARRIER_CLEAR:
            return processTimeBlockMessage(cmd);
        case CMD_FORCE_TIME_GRANT:
            if (time_granted < cmd.actionTime) {
                time_granted = cmd.actionTime;
                time_grantBase = time_granted;

                ActionMessage treq(CMD_TIME_GRANT);
                treq.source_id = mSourceId;
                treq.actionTime = time_granted;
                lastSend.next = time_granted;
                lastSend.Te = time_granted;
                lastSend.minDe = time_granted;
                lastSend.mTimeState = TimeState::time_granted;
                transmitTimingMessages(treq);
                return TimeProcessingResult::PROCESSED;
            }
            return TimeProcessingResult::NOT_PROCESSED;
        case CMD_DISCONNECT:
        case CMD_BROADCAST_DISCONNECT:
        case CMD_DISCONNECT_CORE:
        case CMD_DISCONNECT_FED:
        case CMD_DISCONNECT_BROKER:
        case CMD_GLOBAL_ERROR:
        case CMD_LOCAL_ERROR:
            // this command requires removing dependents as well as dealing with dependency
            // processing
            removeDependent(cmd.source_id);
            break;
        case CMD_REQUEST_CURRENT_TIME:
            if (disconnected || lastSend.mTimeState == TimeState::error) {
                ActionMessage treq(CMD_DISCONNECT, mSourceId, cmd.source_id);
                treq.setExtraDestData(cmd.counter);
                sendMessageFunction(treq);
            } else {
                auto resp = generateTimeRequest(lastSend, cmd.source_id, cmd.counter);
                if (triggered) {
                    setActionFlag(resp, destination_target);
                    if (cmd.source_id == gRootBrokerID) {
                        triggered = false;
                    }
                }
                sendMessageFunction(resp);
                dependencies.updateTime(cmd);
            }

            return TimeProcessingResult::PROCESSED;
        default:
            break;
    }
    if (isDelayableMessage(cmd, mSourceId)) {
        auto* dep = dependencies.getDependencyInfo(cmd.source_id);
        if (dep == nullptr) {
            return TimeProcessingResult::NOT_PROCESSED;
        }
        switch (dep->mTimeState) {
            case TimeState::time_requested:
                if (dep->next > time_exec) {
                    //     return TimeProcessingResult::delay_processing;
                }
                break;
            case TimeState::time_requested_iterative:
                if (dep->next > time_exec) {
                    //         return TimeProcessingResult::delay_processing;
                }
                if ((iterating != IterationRequest::NO_ITERATIONS) && (time_exec == dep->next)) {
                    //       return TimeProcessingResult::delay_processing;
                }
                break;
            case TimeState::exec_requested_iterative:
                if ((iterating != IterationRequest::NO_ITERATIONS) && (checkingExec) &&
                    (dep->hasData)) {
                    //          return TimeProcessingResult::delay_processing;
                }
                break;
            default:
                break;
        }
    }
    auto procRes = dependencies.updateTime(cmd);
    if (procRes == TimeProcessingResult::PROCESSED_AND_CHECK) {
        auto checkRes = dependencies.checkForIssues(info.wait_for_current_time_updates);
        if (checkRes.first != 0) {
            ActionMessage ge(CMD_GLOBAL_ERROR);
            ge.dest_id = parent_broker_id;
            ge.source_id = mSourceId;
            ge.messageID = checkRes.first;
            ge.payload = checkRes.second;
            sendMessageFunction(ge);
        }
        procRes = TimeProcessingResult::PROCESSED;
    }

    return procRes;
}